

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  LZ4_stream_t_internal *__src;
  char cVar1;
  char cVar2;
  uint uVar3;
  BYTE *d;
  long lVar4;
  ulong *puVar5;
  long *plVar6;
  ulong *puVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  BYTE *e;
  ulong *puVar19;
  long *plVar20;
  int iVar21;
  ulong *puVar22;
  ulong *puVar23;
  uint uVar24;
  int iVar25;
  int *piVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong *puVar30;
  ulong *puVar31;
  long *plVar32;
  ulong uVar33;
  ulong *puVar34;
  U32 *hashTable_15;
  int *piVar35;
  char *pcVar36;
  uint uVar37;
  long *plVar38;
  int *piVar39;
  int local_d8;
  U32 *hashTable;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_98;
  int local_90;
  char *local_80;
  U32 *hashTable_18;
  
  if ((ulong)(LZ4_stream->internal_donotuse).dictSize == 0) {
    piVar35 = (int *)0x0;
  }
  else {
    piVar35 = (int *)((LZ4_stream->internal_donotuse).dictionary +
                     (LZ4_stream->internal_donotuse).dictSize);
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  if (acceleration < 2) {
    acceleration = 1;
  }
  if (0x10000 < acceleration) {
    acceleration = 0x10001;
  }
  uVar17 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (((((LZ4_stream->internal_donotuse).dictSize < 4) && (0 < inputSize)) &&
      (piVar35 != (int *)source)) &&
     ((LZ4_stream->internal_donotuse).dictCtx == (LZ4_stream_t_internal *)0x0)) {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    uVar17 = 0;
    piVar35 = (int *)source;
  }
  piVar11 = (int *)(source + inputSize);
  piVar26 = (int *)(LZ4_stream->internal_donotuse).dictionary;
  if ((piVar26 < piVar11) && (piVar11 < piVar35)) {
    uVar15 = (int)piVar35 - (int)piVar11;
    uVar3 = 0x10000;
    if (uVar15 < 0x10000) {
      uVar3 = uVar15;
    }
    uVar17 = 0;
    if (3 < uVar15) {
      uVar17 = (ulong)uVar3;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar17;
    piVar26 = (int *)((long)piVar35 - uVar17);
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)piVar26;
  }
  uVar3 = (uint)uVar17;
  local_90 = (int)dest;
  if (piVar35 == (int *)source) {
    if (uVar3 < 0x10000) {
      uVar15 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar3 < uVar15) {
        if (0x7e000000 < (uint)inputSize) {
          return 0;
        }
        if (inputSize != 0) {
          pcVar36 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize = uVar3 + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = uVar15 + inputSize;
          (LZ4_stream->internal_donotuse).tableType = 2;
          plVar38 = (long *)source;
          if ((uint)inputSize < 0xd) {
LAB_00271cc7:
            pcVar8 = source + ((ulong)(uint)inputSize - (long)plVar38);
            if (pcVar36 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) {
              return 0;
            }
            if (pcVar8 < (char *)0xf) {
              *dest = (char)pcVar8 << 4;
            }
            else {
              *dest = -0x10;
              for (pcVar36 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar36;
                  pcVar36 = pcVar36 + -0xff) {
                *dest = -1;
              }
              *dest = (char)pcVar36;
            }
            memcpy(dest + 1,plVar38,(size_t)pcVar8);
            return ((int)(dest + 1) + (int)pcVar8) - local_90;
          }
          lVar29 = (long)source - (ulong)uVar15;
          *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4)
               = uVar15;
          local_b8 = dest;
LAB_0026ff09:
          uVar12 = 1;
          lVar4 = *(long *)((long)plVar38 + 1);
          plVar6 = (long *)((long)plVar38 + 1);
          uVar10 = acceleration << 6;
          while( true ) {
            plVar32 = (long *)(uVar12 + (long)plVar6);
            dest = local_b8;
            if (source + ((ulong)(uint)inputSize - 0xb) < plVar32) goto LAB_00271cc7;
            uVar12 = (ulong)(lVar4 * -0x30e4432345000000) >> 0x34;
            uVar24 = *(uint *)((long)LZ4_stream + uVar12 * 4);
            iVar9 = (int)plVar6;
            iVar21 = (int)lVar29;
            lVar4 = *plVar32;
            *(int *)((long)LZ4_stream + uVar12 * 4) = iVar9 - iVar21;
            if (((uVar15 - uVar3 <= uVar24) && ((uint)(iVar9 - iVar21) <= uVar24 + 0xffff)) &&
               (*(int *)(lVar29 + (ulong)uVar24) == (int)*plVar6)) break;
            uVar12 = (ulong)(uVar10 >> 6);
            uVar10 = uVar10 + 1;
            plVar6 = plVar32;
          }
          lVar28 = (ulong)uVar24 + lVar29;
          lVar4 = 0;
          cVar1 = (char)plVar6 * '\x10' + (char)plVar38 * -0x10;
          do {
            cVar2 = cVar1;
            lVar13 = lVar4;
            piVar35 = (int *)(lVar28 + lVar13);
            plVar32 = (long *)((long)plVar6 + lVar13);
            if ((piVar35 <= source + -uVar17) || (plVar32 <= plVar38)) break;
            lVar4 = lVar13 + -1;
            cVar1 = cVar2 + -0x10;
          } while (*(char *)((long)plVar6 + lVar13 + -1) == *(char *)(lVar28 + -1 + lVar13));
          local_d8 = (int)plVar38;
          uVar12 = (ulong)(uint)((iVar9 - local_d8) + (int)lVar13);
          uVar33 = (ulong)(uint)(iVar9 - local_d8) + lVar13;
          if (pcVar36 < local_b8 + (uVar33 & 0xffffffff) / 0xff + uVar12 + 9) {
            return 0;
          }
          if ((uint)uVar33 < 0xf) {
            plVar6 = (long *)(local_b8 + 1);
            *local_b8 = cVar2;
          }
          else {
            *local_b8 = -0x10;
            plVar6 = (long *)(local_b8 + 2);
            for (iVar9 = (iVar9 - local_d8) + (int)lVar13 + -0xf; 0xfe < iVar9;
                iVar9 = iVar9 + -0xff) {
              *(char *)((long)plVar6 + -1) = -1;
              plVar6 = (long *)((long)plVar6 + 1);
            }
            *(char *)((long)plVar6 + -1) = (char)iVar9;
          }
          plVar20 = (long *)(uVar12 + (long)plVar6);
          do {
            *plVar6 = *plVar38;
            plVar6 = plVar6 + 1;
            plVar38 = plVar38 + 1;
          } while (plVar6 < plVar20);
          do {
            *(short *)plVar20 = (short)plVar32 - (short)piVar35;
            puVar31 = (ulong *)((long)plVar32 + 4);
            puVar7 = (ulong *)(piVar35 + 1);
            puVar34 = puVar31;
            if (source + ((ulong)(uint)inputSize - 0xc) <= puVar31) {
LAB_002700d7:
              iVar9 = ((int)puVar34 - (int)plVar32) + -4;
LAB_002700df:
              if (puVar34 < source + ((ulong)(uint)inputSize - 0xc)) {
                if (*puVar7 == *puVar34) goto code_r0x002700f3;
                uVar33 = *puVar34 ^ *puVar7;
                uVar12 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
                  }
                }
                uVar10 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar9;
              }
              else {
                if ((puVar34 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar7 == (int)*puVar34)) {
                  puVar34 = (ulong *)((long)puVar34 + 4);
                  puVar7 = (ulong *)((long)puVar7 + 4);
                }
                if ((puVar34 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar7 == (short)*puVar34)) {
                  puVar34 = (ulong *)((long)puVar34 + 2);
                  puVar7 = (ulong *)((long)puVar7 + 2);
                }
                if (puVar34 < source + ((ulong)(uint)inputSize - 5)) {
                  puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar7 == (char)*puVar34));
                }
                uVar10 = (int)puVar34 - (int)puVar31;
              }
              goto LAB_00270118;
            }
            if (*puVar7 == *puVar31) {
              puVar7 = (ulong *)(piVar35 + 3);
              puVar34 = (ulong *)((long)plVar32 + 0xc);
              goto LAB_002700d7;
            }
            uVar12 = *puVar31 ^ *puVar7;
            lVar4 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
              }
            }
            uVar10 = (uint)lVar4 >> 3;
LAB_00270118:
            if (pcVar36 < (char *)((long)plVar20 + (ulong)(uVar10 + 0xf0) / 0xff + 8)) {
              return 0;
            }
            dest = (char *)((long)plVar20 + 2);
            if (uVar10 < 0xf) {
              *local_b8 = *local_b8 + (char)uVar10;
            }
            else {
              *local_b8 = *local_b8 + '\x0f';
              dest[0] = -1;
              dest[1] = -1;
              dest[2] = -1;
              dest[3] = -1;
              lVar4 = 0;
              for (uVar24 = uVar10 - 0xf; 0x3fb < uVar24; uVar24 = uVar24 - 0x3fc) {
                pcVar8 = (char *)((long)plVar20 + lVar4 + 6);
                pcVar8[0] = -1;
                pcVar8[1] = -1;
                pcVar8[2] = -1;
                pcVar8[3] = -1;
                lVar4 = lVar4 + 4;
              }
              lVar28 = lVar4 + ((ulong)uVar24 & 0xffff) / 0xff;
              dest = (char *)((long)plVar20 + lVar28 + 3);
              *(char *)((long)plVar20 + lVar28 + 2) =
                   (char)lVar4 + (char)((uVar24 & 0xffff) / 0xff) + (char)uVar10 + -0xf;
            }
            lVar4 = (long)plVar32 + (ulong)uVar10;
            plVar38 = (long *)(lVar4 + 4);
            if (source + ((ulong)(uint)inputSize - 0xb) <= plVar38) goto LAB_00271cc7;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)(lVar4 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)lVar4 + 2) - iVar21;
            uVar12 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
            uVar24 = (int)plVar38 - iVar21;
            uVar10 = *(uint *)((long)LZ4_stream + uVar12 * 4);
            piVar35 = (int *)((ulong)uVar10 + lVar29);
            *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar24;
            local_b8 = dest;
            if (((uVar10 < uVar15 - uVar3) || (uVar10 + 0xffff < uVar24)) ||
               (*piVar35 != *(int *)plVar38)) goto LAB_0026ff09;
            plVar20 = (long *)(dest + 1);
            *dest = '\0';
            plVar32 = plVar38;
          } while( true );
        }
        goto LAB_00271aa5;
      }
    }
    if (0x7e000000 < (uint)inputSize) {
      return 0;
    }
    if (inputSize != 0) {
      uVar15 = (LZ4_stream->internal_donotuse).currentOffset;
      pcVar36 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar3 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar15 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      plVar38 = (long *)source;
      if ((uint)inputSize < 0xd) {
LAB_00271ac8:
        pcVar8 = source + ((ulong)(uint)inputSize - (long)plVar38);
        if (pcVar36 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) {
          return 0;
        }
        if (pcVar8 < (char *)0xf) {
          *dest = (char)pcVar8 << 4;
        }
        else {
          *dest = -0x10;
          for (pcVar36 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar36;
              pcVar36 = pcVar36 + -0xff) {
            *dest = -1;
          }
          *dest = (char)pcVar36;
        }
        memcpy(dest + 1,plVar38,(size_t)pcVar8);
        return ((int)(dest + 1) + (int)pcVar8) - local_90;
      }
      lVar29 = (long)source - (ulong)uVar15;
      *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar15;
      pcVar8 = dest;
LAB_00270307:
      uVar12 = 1;
      lVar4 = *(long *)((long)plVar38 + 1);
      plVar6 = (long *)((long)plVar38 + 1);
      uVar3 = acceleration << 6;
      while( true ) {
        plVar32 = (long *)(uVar12 + (long)plVar6);
        dest = pcVar8;
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar32) goto LAB_00271ac8;
        uVar12 = (ulong)(lVar4 * -0x30e4432345000000) >> 0x34;
        uVar15 = *(uint *)((long)LZ4_stream + uVar12 * 4);
        iVar9 = (int)plVar6;
        iVar21 = (int)lVar29;
        lVar4 = *plVar32;
        *(int *)((long)LZ4_stream + uVar12 * 4) = iVar9 - iVar21;
        if (((uint)(iVar9 - iVar21) <= uVar15 + 0xffff) &&
           (*(int *)(lVar29 + (ulong)uVar15) == (int)*plVar6)) break;
        uVar12 = (ulong)(uVar3 >> 6);
        uVar3 = uVar3 + 1;
        plVar6 = plVar32;
      }
      lVar28 = (ulong)uVar15 + lVar29;
      lVar4 = 0;
      cVar1 = (char)plVar6 * '\x10' + (char)plVar38 * -0x10;
      do {
        cVar2 = cVar1;
        lVar13 = lVar4;
        piVar35 = (int *)(lVar28 + lVar13);
        plVar32 = (long *)((long)plVar6 + lVar13);
        if ((piVar35 <= source + -uVar17) || (plVar32 <= plVar38)) break;
        lVar4 = lVar13 + -1;
        cVar1 = cVar2 + -0x10;
      } while (*(char *)((long)plVar6 + lVar13 + -1) == *(char *)(lVar28 + -1 + lVar13));
      local_d8 = (int)plVar38;
      uVar33 = (ulong)(uint)((iVar9 - local_d8) + (int)lVar13);
      uVar12 = (ulong)(uint)(iVar9 - local_d8) + lVar13;
      if (pcVar36 < pcVar8 + (uVar12 & 0xffffffff) / 0xff + uVar33 + 9) {
        return 0;
      }
      if ((uint)uVar12 < 0xf) {
        plVar6 = (long *)(pcVar8 + 1);
        *pcVar8 = cVar2;
      }
      else {
        *pcVar8 = -0x10;
        plVar6 = (long *)(pcVar8 + 2);
        for (iVar9 = (iVar9 - local_d8) + (int)lVar13 + -0xf; 0xfe < iVar9; iVar9 = iVar9 + -0xff) {
          *(char *)((long)plVar6 + -1) = -1;
          plVar6 = (long *)((long)plVar6 + 1);
        }
        *(char *)((long)plVar6 + -1) = (char)iVar9;
      }
      plVar20 = (long *)(uVar33 + (long)plVar6);
      do {
        *plVar6 = *plVar38;
        plVar6 = plVar6 + 1;
        plVar38 = plVar38 + 1;
      } while (plVar6 < plVar20);
      do {
        *(short *)plVar20 = (short)plVar32 - (short)piVar35;
        puVar31 = (ulong *)((long)plVar32 + 4);
        puVar7 = (ulong *)(piVar35 + 1);
        puVar34 = puVar31;
        if (source + ((ulong)(uint)inputSize - 0xc) <= puVar31) {
LAB_002704c6:
          iVar9 = ((int)puVar34 - (int)plVar32) + -4;
LAB_002704ce:
          if (puVar34 < source + ((ulong)(uint)inputSize - 0xc)) {
            if (*puVar7 == *puVar34) goto code_r0x002704e2;
            uVar33 = *puVar34 ^ *puVar7;
            uVar12 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
              }
            }
            uVar3 = ((uint)(uVar12 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar34 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar7 == (int)*puVar34)
               ) {
              puVar34 = (ulong *)((long)puVar34 + 4);
              puVar7 = (ulong *)((long)puVar7 + 4);
            }
            if ((puVar34 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar7 == (short)*puVar34)) {
              puVar34 = (ulong *)((long)puVar34 + 2);
              puVar7 = (ulong *)((long)puVar7 + 2);
            }
            if (puVar34 < source + ((ulong)(uint)inputSize - 5)) {
              puVar34 = (ulong *)((long)puVar34 + (ulong)((char)*puVar7 == (char)*puVar34));
            }
            uVar3 = (int)puVar34 - (int)puVar31;
          }
          goto LAB_00270507;
        }
        if (*puVar7 == *puVar31) {
          puVar7 = (ulong *)(piVar35 + 3);
          puVar34 = (ulong *)((long)plVar32 + 0xc);
          goto LAB_002704c6;
        }
        uVar12 = *puVar31 ^ *puVar7;
        lVar4 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
          }
        }
        uVar3 = (uint)lVar4 >> 3;
LAB_00270507:
        if (pcVar36 < (char *)((long)plVar20 + (ulong)(uVar3 + 0xf0) / 0xff + 8)) {
          return 0;
        }
        dest = (char *)((long)plVar20 + 2);
        if (uVar3 < 0xf) {
          *pcVar8 = *pcVar8 + (char)uVar3;
        }
        else {
          *pcVar8 = *pcVar8 + '\x0f';
          dest[0] = -1;
          dest[1] = -1;
          dest[2] = -1;
          dest[3] = -1;
          lVar4 = 0;
          for (uVar15 = uVar3 - 0xf; 0x3fb < uVar15; uVar15 = uVar15 - 0x3fc) {
            pcVar8 = (char *)((long)plVar20 + lVar4 + 6);
            pcVar8[0] = -1;
            pcVar8[1] = -1;
            pcVar8[2] = -1;
            pcVar8[3] = -1;
            lVar4 = lVar4 + 4;
          }
          lVar28 = lVar4 + ((ulong)uVar15 & 0xffff) / 0xff;
          dest = (char *)((long)plVar20 + lVar28 + 3);
          *(char *)((long)plVar20 + lVar28 + 2) =
               (char)lVar4 + (char)((uVar15 & 0xffff) / 0xff) + (char)uVar3 + -0xf;
        }
        lVar4 = (long)plVar32 + (ulong)uVar3;
        plVar38 = (long *)(lVar4 + 4);
        if (source + ((ulong)(uint)inputSize - 0xb) <= plVar38) goto LAB_00271ac8;
        *(int *)((long)LZ4_stream +
                ((ulong)(*(long *)(lVar4 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
             ((int)lVar4 + 2) - iVar21;
        uVar12 = (ulong)(*plVar38 * -0x30e4432345000000) >> 0x34;
        uVar15 = (int)plVar38 - iVar21;
        uVar3 = *(uint *)((long)LZ4_stream + uVar12 * 4);
        piVar35 = (int *)((ulong)uVar3 + lVar29);
        *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar15;
        pcVar8 = dest;
        if ((uVar3 + 0xffff < uVar15) || (*piVar35 != *(int *)plVar38)) goto LAB_00270307;
        plVar20 = (long *)(dest + 1);
        *dest = '\0';
        plVar32 = plVar38;
      } while( true );
    }
LAB_00271aa5:
    if (maxOutputSize < 1) {
      return 0;
    }
    *dest = '\0';
    return 1;
  }
  __src = (LZ4_stream->internal_donotuse).dictCtx;
  puVar31 = (ulong *)source;
  if (__src == (LZ4_stream_t_internal *)0x0) {
    if (uVar3 < 0x10000) {
      uVar15 = (LZ4_stream->internal_donotuse).currentOffset;
      if (uVar3 < uVar15) {
        iVar9 = 0;
        if (0x7e000000 < (uint)inputSize) goto LAB_00271c88;
        if (inputSize != 0) {
          lVar4 = uVar17 + (long)piVar26;
          lVar29 = lVar4 - (ulong)uVar15;
          if (piVar26 == (int *)0x0) {
            lVar29 = 0;
          }
          pcVar36 = dest + maxOutputSize;
          (LZ4_stream->internal_donotuse).dictSize = uVar3 + inputSize;
          (LZ4_stream->internal_donotuse).currentOffset = uVar15 + inputSize;
          (LZ4_stream->internal_donotuse).tableType = 2;
          if (0xc < (uint)inputSize) {
            lVar28 = (long)source - (ulong)uVar15;
            if (piVar26 == (int *)0x0) {
              lVar4 = 0;
            }
            puVar34 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
            *(uint *)((long)LZ4_stream +
                     ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar15;
            puVar7 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
            local_80 = dest;
LAB_00270767:
            uVar12 = 1;
            uVar17 = *(ulong *)((long)puVar31 + 1);
            puVar5 = (ulong *)((long)puVar31 + 1);
            uVar10 = acceleration << 6;
            do {
              puVar30 = (ulong *)(uVar12 + (long)puVar5);
              dest = local_80;
              if (source + ((ulong)(uint)inputSize - 0xb) < puVar30) break;
              uVar12 = uVar17 * -0x30e4432345000000 >> 0x34;
              iVar21 = (int)puVar5;
              iVar18 = (int)lVar28;
              uVar37 = iVar21 - iVar18;
              uVar24 = *(uint *)((long)LZ4_stream + uVar12 * 4);
              uVar17 = *puVar30;
              *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar37;
              if ((uVar15 - uVar3 <= uVar24) && (uVar37 <= uVar24 + 0xffff)) {
                lVar13 = lVar29;
                if (uVar15 <= uVar24) {
                  lVar13 = lVar28;
                }
                if (*(int *)(lVar13 + (ulong)uVar24) == (int)*puVar5) goto LAB_002707de;
              }
              uVar12 = (ulong)(uVar10 >> 6);
              uVar10 = uVar10 + 1;
              puVar5 = puVar30;
            } while( true );
          }
LAB_00271d33:
          pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar31);
          iVar9 = 0;
          if (pcVar36 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1))
          goto LAB_00271c88;
          if (pcVar8 < (char *)0xf) {
            *dest = (char)pcVar8 << 4;
          }
          else {
            *dest = -0x10;
            for (pcVar36 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar36;
                pcVar36 = pcVar36 + -0xff) {
              *dest = -1;
            }
            *dest = (char)pcVar36;
          }
          goto LAB_00271c18;
        }
        goto LAB_00271a8d;
      }
    }
    iVar9 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_00271c88;
    if (inputSize != 0) {
      uVar15 = (LZ4_stream->internal_donotuse).currentOffset;
      lVar4 = uVar17 + (long)piVar26;
      lVar29 = lVar4 - (ulong)uVar15;
      if (piVar26 == (int *)0x0) {
        lVar29 = 0;
      }
      pcVar36 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = uVar3 + inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar15 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar28 = (long)source - (ulong)uVar15;
        if (piVar26 == (int *)0x0) {
          lVar4 = 0;
        }
        puVar34 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar15;
        puVar7 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        local_98 = dest;
LAB_002714e9:
        uVar12 = 1;
        uVar17 = *(ulong *)((long)puVar31 + 1);
        puVar5 = (ulong *)((long)puVar31 + 1);
        uVar3 = acceleration << 6;
        do {
          puVar30 = (ulong *)(uVar12 + (long)puVar5);
          dest = local_98;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar30) break;
          uVar12 = uVar17 * -0x30e4432345000000 >> 0x34;
          iVar21 = (int)puVar5;
          iVar18 = (int)lVar28;
          uVar24 = iVar21 - iVar18;
          uVar10 = *(uint *)((long)LZ4_stream + uVar12 * 4);
          uVar17 = *puVar30;
          *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar24;
          if (uVar24 <= uVar10 + 0xffff) {
            lVar13 = lVar29;
            if (uVar15 <= uVar10) {
              lVar13 = lVar28;
            }
            if (*(int *)(lVar13 + (ulong)uVar10) == (int)*puVar5) goto LAB_0027154c;
          }
          uVar12 = (ulong)(uVar3 >> 6);
          uVar3 = uVar3 + 1;
          puVar5 = puVar30;
        } while( true );
      }
LAB_00271bad:
      pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar31);
      iVar9 = 0;
      if (pcVar36 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) goto LAB_00271c88;
      if (pcVar8 < (char *)0xf) {
        *dest = (char)pcVar8 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar36 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar36;
            pcVar36 = pcVar36 + -0xff) {
          *dest = -1;
        }
        *dest = (char)pcVar36;
      }
      goto LAB_00271c75;
    }
  }
  else {
    if (0x1000 < inputSize) {
      memcpy(LZ4_stream,__src,0x4020);
      iVar9 = 0;
      if ((uint)inputSize < 0x7e000001) {
        uVar3 = (LZ4_stream->internal_donotuse).currentOffset;
        lVar28 = (long)source - (ulong)uVar3;
        piVar35 = (int *)(LZ4_stream->internal_donotuse).dictionary;
        lVar29 = (ulong)(LZ4_stream->internal_donotuse).dictSize + (long)piVar35;
        lVar4 = lVar29 - (ulong)uVar3;
        if (piVar35 == (int *)0x0) {
          lVar29 = 0;
        }
        puVar7 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar35 == (int *)0x0) {
          lVar4 = 0;
        }
        pcVar36 = dest + maxOutputSize;
        (LZ4_stream->internal_donotuse).dictSize =
             (LZ4_stream->internal_donotuse).dictSize + inputSize;
        (LZ4_stream->internal_donotuse).currentOffset = uVar3 + inputSize;
        (LZ4_stream->internal_donotuse).tableType = 2;
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar3;
        puVar34 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        local_b0 = dest;
LAB_0026f8d9:
        uVar12 = 1;
        uVar17 = *(ulong *)((long)puVar31 + 1);
        puVar5 = (ulong *)((long)puVar31 + 1);
        uVar15 = acceleration << 6;
        do {
          puVar30 = (ulong *)(uVar12 + (long)puVar5);
          dest = local_b0;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar30) goto LAB_00271a29;
          uVar12 = uVar17 * -0x30e4432345000000 >> 0x34;
          iVar21 = (int)puVar5;
          iVar18 = (int)lVar28;
          uVar24 = iVar21 - iVar18;
          uVar10 = *(uint *)((long)LZ4_stream + uVar12 * 4);
          uVar17 = *puVar30;
          *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar24;
          if (uVar24 <= uVar10 + 0xffff) {
            lVar13 = lVar4;
            if (uVar3 <= uVar10) {
              lVar13 = lVar28;
            }
            if (*(int *)(lVar13 + (ulong)uVar10) == (int)*puVar5) goto LAB_0026f948;
          }
          uVar12 = (ulong)(uVar15 >> 6);
          uVar15 = uVar15 + 1;
          puVar5 = puVar30;
        } while( true );
      }
      goto LAB_00271c88;
    }
    iVar9 = 0;
    if (0x7e000000 < (uint)inputSize) goto LAB_00271c88;
    if (inputSize != 0) {
      uVar3 = (LZ4_stream->internal_donotuse).currentOffset;
      piVar35 = (int *)__src->dictionary;
      uVar15 = __src->currentOffset;
      lVar4 = (ulong)__src->dictSize + (long)piVar35;
      lVar29 = lVar4 - (ulong)uVar15;
      if (piVar35 == (int *)0x0) {
        lVar29 = 0;
      }
      (LZ4_stream->internal_donotuse).dictCtx = (LZ4_stream_t_internal *)0x0;
      pcVar36 = dest + maxOutputSize;
      (LZ4_stream->internal_donotuse).dictSize = inputSize;
      (LZ4_stream->internal_donotuse).currentOffset = uVar3 + inputSize;
      (LZ4_stream->internal_donotuse).tableType = 2;
      if (0xc < (uint)inputSize) {
        lVar28 = (long)source - (ulong)uVar3;
        iVar21 = uVar3 - uVar15;
        puVar7 = (ulong *)(source + ((ulong)(uint)inputSize - 5));
        if (piVar35 == (int *)0x0) {
          lVar4 = 0;
        }
        *(uint *)((long)LZ4_stream + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
             uVar3;
        puVar34 = (ulong *)(source + ((ulong)(uint)inputSize - 0xc));
        local_a8 = dest;
LAB_00270e32:
        uVar17 = *(ulong *)((long)puVar31 + 1);
        uVar12 = 1;
        puVar5 = (ulong *)((long)puVar31 + 1);
        uVar15 = acceleration << 6;
        while( true ) {
          puVar30 = (ulong *)(uVar12 + (long)puVar5);
          dest = local_a8;
          if (source + ((ulong)(uint)inputSize - 0xb) < puVar30) goto LAB_00271b3f;
          uVar12 = uVar17 * -0x30e4432345000000 >> 0x34;
          uVar10 = *(uint *)((long)LZ4_stream + uVar12 * 4);
          if (uVar10 < uVar3) {
            uVar10 = __src->hashTable[uVar12] + iVar21;
            piVar26 = (int *)((ulong)__src->hashTable[uVar12] + lVar29);
            piVar11 = piVar35;
          }
          else {
            piVar26 = (int *)((ulong)uVar10 + lVar28);
            piVar11 = (int *)source;
          }
          iVar25 = (int)puVar5;
          iVar18 = (int)lVar28;
          uVar24 = iVar25 - iVar18;
          uVar17 = *puVar30;
          *(uint *)((long)LZ4_stream + uVar12 * 4) = uVar24;
          if ((uVar24 <= uVar10 + 0xffff) && (*piVar26 == (int)*puVar5)) break;
          uVar12 = (ulong)(uVar15 >> 6);
          uVar15 = uVar15 + 1;
          puVar5 = puVar30;
        }
        iVar27 = uVar24 - uVar10;
        lVar13 = 0;
        cVar1 = (char)puVar5 * '\x10' + (char)puVar31 * -0x10;
        do {
          cVar2 = cVar1;
          lVar16 = lVar13;
          piVar39 = (int *)((long)piVar26 + lVar16);
          puVar30 = (ulong *)((long)puVar5 + lVar16);
          if ((piVar39 <= piVar11) || (puVar30 <= puVar31)) break;
          lVar13 = lVar16 + -1;
          cVar1 = cVar2 + -0x10;
        } while (*(char *)((long)puVar5 + lVar16 + -1) == *(char *)((long)piVar26 + lVar16 + -1));
        uVar15 = iVar25 - (int)puVar31;
        uVar17 = (ulong)(uVar15 + (int)lVar16);
        uVar12 = (ulong)uVar15 + lVar16;
        iVar9 = 0;
        if (local_a8 + (uVar12 & 0xffffffff) / 0xff + uVar17 + 9 <= pcVar36) {
          if ((uint)uVar12 < 0xf) {
            puVar5 = (ulong *)(local_a8 + 1);
            *local_a8 = cVar2;
          }
          else {
            *local_a8 = -0x10;
            puVar5 = (ulong *)(local_a8 + 2);
            for (iVar9 = (iVar25 - (int)puVar31) + (int)lVar16 + -0xf; 0xfe < iVar9;
                iVar9 = iVar9 + -0xff) {
              *(char *)((long)puVar5 + -1) = -1;
              puVar5 = (ulong *)((long)puVar5 + 1);
            }
            *(char *)((long)puVar5 + -1) = (char)iVar9;
          }
          puVar19 = (ulong *)(uVar17 + (long)puVar5);
          do {
            *puVar5 = *puVar31;
            puVar5 = puVar5 + 1;
            puVar31 = puVar31 + 1;
          } while (puVar5 < puVar19);
          do {
            *(short *)puVar19 = (short)iVar27;
            if (piVar11 == piVar35) {
              puVar5 = (ulong *)((lVar4 - (long)piVar39) + (long)puVar30);
              if (puVar7 < puVar5) {
                puVar5 = puVar7;
              }
              puVar31 = (ulong *)((long)puVar30 + 4);
              puVar22 = (ulong *)(piVar39 + 1);
              puVar23 = puVar31;
              if ((ulong *)((long)puVar5 - 7U) <= puVar31) {
LAB_00271183:
                iVar9 = ((int)puVar23 - (int)puVar30) + -4;
LAB_0027118d:
                if (puVar23 < (ulong *)((long)puVar5 - 7U)) {
                  if (*puVar22 == *puVar23) goto code_r0x002711a1;
                  uVar12 = *puVar23 ^ *puVar22;
                  uVar17 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar15 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
                }
                else {
                  if ((puVar23 < (ulong *)((long)puVar5 - 3U)) && ((int)*puVar22 == (int)*puVar23))
                  {
                    puVar23 = (ulong *)((long)puVar23 + 4);
                    puVar22 = (ulong *)((long)puVar22 + 4);
                  }
                  if ((puVar23 < (ulong *)((long)puVar5 - 1U)) &&
                     ((short)*puVar22 == (short)*puVar23)) {
                    puVar23 = (ulong *)((long)puVar23 + 2);
                    puVar22 = (ulong *)((long)puVar22 + 2);
                  }
                  if (puVar23 < puVar5) {
                    puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
                  }
                  uVar15 = (int)puVar23 - (int)puVar31;
                }
                goto LAB_002711f2;
              }
              if (*puVar22 == *puVar31) {
                puVar22 = (ulong *)(piVar39 + 3);
                puVar23 = (ulong *)((long)puVar30 + 0xc);
                goto LAB_00271183;
              }
              uVar17 = *puVar31 ^ *puVar22;
              lVar13 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar15 = (uint)lVar13 >> 3;
LAB_002711f2:
              puVar31 = (ulong *)((long)puVar30 + (ulong)uVar15 + 4);
              if (puVar31 == puVar5) {
                puVar31 = puVar5;
                puVar22 = (ulong *)source;
                if (puVar34 <= puVar5) {
LAB_00271224:
                  puVar30 = (ulong *)((long)puVar30 + (lVar4 - (long)piVar39));
                  if (puVar7 <= puVar30) {
                    puVar30 = puVar7;
                  }
                  iVar9 = (int)puVar31 - (int)puVar30;
LAB_0027123e:
                  if (puVar31 < puVar34) {
                    if (*puVar22 == *puVar31) goto code_r0x00271252;
                    uVar12 = *puVar31 ^ *puVar22;
                    uVar17 = 0;
                    if (uVar12 != 0) {
                      for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                      }
                    }
                    uVar10 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
                  }
                  else {
                    if ((puVar31 < source + ((ulong)(uint)inputSize - 8)) &&
                       ((int)*puVar22 == (int)*puVar31)) {
                      puVar31 = (ulong *)((long)puVar31 + 4);
                      puVar22 = (ulong *)((long)puVar22 + 4);
                    }
                    if ((puVar31 < source + ((ulong)(uint)inputSize - 6)) &&
                       ((short)*puVar22 == (short)*puVar31)) {
                      puVar31 = (ulong *)((long)puVar31 + 2);
                      puVar22 = (ulong *)((long)puVar22 + 2);
                    }
                    if (puVar31 < puVar7) {
                      puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar22 == (char)*puVar31))
                      ;
                    }
                    uVar10 = (int)puVar31 - (int)puVar5;
                  }
                  goto LAB_00271277;
                }
                if (*(ulong *)source == *puVar5) {
                  puVar31 = puVar5 + 1;
                  puVar22 = (ulong *)(source + 8);
                  goto LAB_00271224;
                }
                uVar17 = *puVar5 ^ *(ulong *)source;
                lVar13 = 0;
                if (uVar17 != 0) {
                  for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                uVar10 = (uint)lVar13 >> 3;
LAB_00271277:
                uVar15 = uVar15 + uVar10;
                puVar31 = (ulong *)((long)puVar5 + (ulong)uVar10);
              }
            }
            else {
              puVar31 = (ulong *)((long)puVar30 + 4);
              puVar5 = (ulong *)(piVar39 + 1);
              puVar22 = puVar31;
              if (puVar34 <= puVar31) {
LAB_00271116:
                iVar9 = ((int)puVar22 - (int)puVar30) + -4;
LAB_0027111e:
                if (puVar22 < puVar34) {
                  if (*puVar5 == *puVar22) goto code_r0x00271136;
                  uVar12 = *puVar22 ^ *puVar5;
                  uVar17 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                    }
                  }
                  uVar15 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
                }
                else {
                  if ((puVar22 < source + ((ulong)(uint)inputSize - 8)) &&
                     ((int)*puVar5 == (int)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 4);
                    puVar5 = (ulong *)((long)puVar5 + 4);
                  }
                  if ((puVar22 < source + ((ulong)(uint)inputSize - 6)) &&
                     ((short)*puVar5 == (short)*puVar22)) {
                    puVar22 = (ulong *)((long)puVar22 + 2);
                    puVar5 = (ulong *)((long)puVar5 + 2);
                  }
                  if (puVar22 < puVar7) {
                    puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar5 == (char)*puVar22));
                  }
                  uVar15 = (int)puVar22 - (int)puVar31;
                }
                goto LAB_002711c7;
              }
              if (*puVar5 == *puVar31) {
                puVar5 = (ulong *)(piVar39 + 3);
                puVar22 = (ulong *)((long)puVar30 + 0xc);
                goto LAB_00271116;
              }
              uVar17 = *puVar31 ^ *puVar5;
              lVar13 = 0;
              if (uVar17 != 0) {
                for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              uVar15 = (uint)lVar13 >> 3;
LAB_002711c7:
              puVar31 = (ulong *)((long)puVar30 + (ulong)uVar15 + 4);
            }
            iVar9 = 0;
            if (pcVar36 < (char *)((long)puVar19 + (ulong)(uVar15 + 0xf0) / 0xff + 8)) break;
            dest = (char *)((long)puVar19 + 2);
            if (uVar15 < 0xf) {
              *local_a8 = *local_a8 + (char)uVar15;
            }
            else {
              *local_a8 = *local_a8 + '\x0f';
              dest[0] = -1;
              dest[1] = -1;
              dest[2] = -1;
              dest[3] = -1;
              lVar13 = 0;
              for (uVar10 = uVar15 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
                pcVar8 = (char *)((long)puVar19 + lVar13 + 6);
                pcVar8[0] = -1;
                pcVar8[1] = -1;
                pcVar8[2] = -1;
                pcVar8[3] = -1;
                lVar13 = lVar13 + 4;
              }
              lVar16 = lVar13 + ((ulong)uVar10 & 0xffff) / 0xff;
              dest = (char *)((long)puVar19 + lVar16 + 3);
              *(char *)((long)puVar19 + lVar16 + 2) =
                   (char)lVar13 + (char)((uVar10 & 0xffff) / 0xff) + (char)uVar15 + -0xf;
            }
            if (source + ((ulong)(uint)inputSize - 0xb) <= puVar31) goto LAB_00271b3f;
            *(int *)((long)LZ4_stream +
                    ((ulong)(*(long *)((long)puVar31 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
                 ((int)puVar31 + -2) - iVar18;
            uVar17 = *puVar31 * -0x30e4432345000000 >> 0x34;
            uVar15 = *(uint *)((long)LZ4_stream + uVar17 * 4);
            if (uVar15 < uVar3) {
              uVar15 = iVar21 + __src->hashTable[uVar17];
              piVar39 = (int *)((ulong)__src->hashTable[uVar17] + lVar29);
              piVar11 = piVar35;
            }
            else {
              piVar39 = (int *)((ulong)uVar15 + lVar28);
              piVar11 = (int *)source;
            }
            uVar10 = (int)puVar31 - iVar18;
            *(uint *)((long)LZ4_stream + uVar17 * 4) = uVar10;
            local_a8 = dest;
            if ((uVar15 + 0xffff < uVar10) || (*piVar39 != (int)*puVar31)) goto LAB_00270e32;
            puVar19 = (ulong *)(dest + 1);
            *dest = '\0';
            iVar27 = uVar10 - uVar15;
            puVar30 = puVar31;
          } while( true );
        }
        goto LAB_00271c88;
      }
LAB_00271b3f:
      pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar31);
      iVar9 = 0;
      if (pcVar36 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) goto LAB_00271c88;
      if (pcVar8 < (char *)0xf) {
        *dest = (char)pcVar8 << 4;
      }
      else {
        *dest = -0x10;
        for (pcVar36 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar36;
            pcVar36 = pcVar36 + -0xff) {
          *dest = -1;
        }
        *dest = (char)pcVar36;
      }
LAB_00271c75:
      pcVar36 = dest + 1;
      iVar9 = (int)pcVar36;
      goto LAB_00271c78;
    }
  }
LAB_00271a8d:
  iVar9 = 0;
  if (0 < maxOutputSize) {
    *dest = '\0';
    iVar9 = 1;
  }
LAB_00271c88:
  (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar9;
code_r0x002704e2:
  puVar34 = puVar34 + 1;
  puVar7 = puVar7 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_002704ce;
code_r0x002700f3:
  puVar34 = puVar34 + 1;
  puVar7 = puVar7 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_002700df;
LAB_002707de:
  lVar13 = lVar13 + (ulong)uVar24;
  piVar35 = (int *)source;
  if (uVar24 < uVar15) {
    piVar35 = piVar26;
  }
  iVar25 = uVar37 - uVar24;
  lVar16 = 0;
  cVar1 = (char)puVar5 * '\x10' + (char)puVar31 * -0x10;
  do {
    cVar2 = cVar1;
    lVar14 = lVar16;
    piVar11 = (int *)(lVar13 + lVar14);
    puVar30 = (ulong *)((long)puVar5 + lVar14);
    if ((piVar11 <= piVar35) || (puVar30 <= puVar31)) break;
    lVar16 = lVar14 + -1;
    cVar1 = cVar2 + -0x10;
  } while (*(char *)((long)puVar5 + lVar14 + -1) == *(char *)(lVar13 + -1 + lVar14));
  uVar10 = iVar21 - (int)puVar31;
  uVar17 = (ulong)((int)lVar14 + uVar10);
  uVar12 = (ulong)uVar10 + lVar14;
  iVar9 = 0;
  if (local_80 + (uVar12 & 0xffffffff) / 0xff + uVar17 + 9 <= pcVar36) {
    if ((uint)uVar12 < 0xf) {
      puVar5 = (ulong *)(local_80 + 1);
      *local_80 = cVar2;
    }
    else {
      *local_80 = -0x10;
      puVar5 = (ulong *)(local_80 + 2);
      for (iVar9 = (iVar21 - (int)puVar31) + (int)lVar14 + -0xf; 0xfe < iVar9; iVar9 = iVar9 + -0xff
          ) {
        *(char *)((long)puVar5 + -1) = -1;
        puVar5 = (ulong *)((long)puVar5 + 1);
      }
      *(char *)((long)puVar5 + -1) = (char)iVar9;
    }
    puVar19 = (ulong *)(uVar17 + (long)puVar5);
    do {
      *puVar5 = *puVar31;
      puVar5 = puVar5 + 1;
      puVar31 = puVar31 + 1;
    } while (puVar5 < puVar19);
    do {
      *(short *)puVar19 = (short)iVar25;
      if (piVar35 == piVar26) {
        puVar5 = (ulong *)((lVar4 - (long)piVar11) + (long)puVar30);
        if (puVar34 < puVar5) {
          puVar5 = puVar34;
        }
        puVar31 = (ulong *)((long)puVar30 + 4);
        puVar22 = (ulong *)(piVar11 + 1);
        puVar23 = puVar31;
        if ((ulong *)((long)puVar5 - 7U) <= puVar31) {
LAB_00270a8a:
          iVar9 = ((int)puVar23 - (int)puVar30) + -4;
LAB_00270a94:
          if (puVar23 < (ulong *)((long)puVar5 - 7U)) {
            if (*puVar22 == *puVar23) goto code_r0x00270aa8;
            uVar12 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar10 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar23 < (ulong *)((long)puVar5 - 3U)) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < (ulong *)((long)puVar5 - 1U)) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < puVar5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
            uVar10 = (int)puVar23 - (int)puVar31;
          }
          goto LAB_00270af5;
        }
        if (*puVar22 == *puVar31) {
          puVar22 = (ulong *)(piVar11 + 3);
          puVar23 = (ulong *)((long)puVar30 + 0xc);
          goto LAB_00270a8a;
        }
        uVar17 = *puVar31 ^ *puVar22;
        lVar13 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar10 = (uint)lVar13 >> 3;
LAB_00270af5:
        puVar31 = (ulong *)((long)puVar30 + (ulong)uVar10 + 4);
        if (puVar31 == puVar5) {
          puVar31 = puVar5;
          puVar22 = (ulong *)source;
          if (puVar7 <= puVar5) {
LAB_00270b32:
            puVar30 = (ulong *)((long)puVar30 + (lVar4 - (long)piVar11));
            if (puVar34 <= puVar30) {
              puVar30 = puVar34;
            }
            iVar9 = (int)puVar31 - (int)puVar30;
LAB_00270b4b:
            if (puVar31 < puVar7) {
              if (*puVar22 == *puVar31) goto code_r0x00270b5f;
              uVar12 = *puVar31 ^ *puVar22;
              uVar17 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar24 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
            }
            else {
              if ((puVar31 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar22 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar31 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar22 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar31 < puVar34) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar22 == (char)*puVar31));
              }
              uVar24 = (int)puVar31 - (int)puVar5;
            }
            goto LAB_00270b84;
          }
          if (*(ulong *)source == *puVar5) {
            puVar31 = puVar5 + 1;
            puVar22 = (ulong *)(source + 8);
            goto LAB_00270b32;
          }
          uVar17 = *puVar5 ^ *(ulong *)source;
          lVar13 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar24 = (uint)lVar13 >> 3;
LAB_00270b84:
          uVar10 = uVar10 + uVar24;
          puVar31 = (ulong *)((long)puVar5 + (ulong)uVar24);
        }
      }
      else {
        puVar31 = (ulong *)((long)puVar30 + 4);
        puVar5 = (ulong *)(piVar11 + 1);
        puVar22 = puVar31;
        if (puVar7 <= puVar31) {
LAB_00270a1e:
          iVar9 = ((int)puVar22 - (int)puVar30) + -4;
LAB_00270a26:
          if (puVar22 < puVar7) {
            if (*puVar5 == *puVar22) goto code_r0x00270a3e;
            uVar12 = *puVar22 ^ *puVar5;
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar10 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar22 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar5 == (int)*puVar22)
               ) {
              puVar22 = (ulong *)((long)puVar22 + 4);
              puVar5 = (ulong *)((long)puVar5 + 4);
            }
            if ((puVar22 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar5 == (short)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 2);
              puVar5 = (ulong *)((long)puVar5 + 2);
            }
            if (puVar22 < puVar34) {
              puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar5 == (char)*puVar22));
            }
            uVar10 = (int)puVar22 - (int)puVar31;
          }
          goto LAB_00270ace;
        }
        if (*puVar5 == *puVar31) {
          puVar5 = (ulong *)(piVar11 + 3);
          puVar22 = (ulong *)((long)puVar30 + 0xc);
          goto LAB_00270a1e;
        }
        uVar17 = *puVar31 ^ *puVar5;
        lVar13 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar10 = (uint)lVar13 >> 3;
LAB_00270ace:
        puVar31 = (ulong *)((long)puVar30 + (ulong)uVar10 + 4);
      }
      iVar9 = 0;
      if (pcVar36 < (char *)((long)puVar19 + (ulong)(uVar10 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar19 + 2);
      if (uVar10 < 0xf) {
        *local_80 = *local_80 + (char)uVar10;
      }
      else {
        *local_80 = *local_80 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar13 = 0;
        for (uVar24 = uVar10 - 0xf; 0x3fb < uVar24; uVar24 = uVar24 - 0x3fc) {
          pcVar8 = (char *)((long)puVar19 + lVar13 + 6);
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
          lVar13 = lVar13 + 4;
        }
        lVar16 = lVar13 + ((ulong)uVar24 & 0xffff) / 0xff;
        dest = (char *)((long)puVar19 + lVar16 + 3);
        *(char *)((long)puVar19 + lVar16 + 2) =
             (char)lVar13 + (char)((uVar24 & 0xffff) / 0xff) + (char)uVar10 + -0xf;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar31) goto LAB_00271d33;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar31 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar31 + -2) - iVar18;
      uVar17 = *puVar31 * -0x30e4432345000000 >> 0x34;
      uVar24 = (int)puVar31 - iVar18;
      uVar10 = *(uint *)((long)LZ4_stream + uVar17 * 4);
      piVar35 = (int *)source;
      lVar13 = lVar28;
      if (uVar10 < uVar15) {
        piVar35 = piVar26;
        lVar13 = lVar29;
      }
      piVar11 = (int *)(lVar13 + (ulong)uVar10);
      *(uint *)((long)LZ4_stream + uVar17 * 4) = uVar24;
      local_80 = dest;
      if (((uVar10 < uVar15 - uVar3) || (uVar10 + 0xffff < uVar24)) || (*piVar11 != (int)*puVar31))
      goto LAB_00270767;
      puVar19 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar25 = uVar24 - uVar10;
      puVar30 = puVar31;
    } while( true );
  }
  goto LAB_00271c88;
code_r0x00270aa8:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_00270a94;
code_r0x00270b5f:
  puVar31 = puVar31 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_00270b4b;
code_r0x00270a3e:
  puVar22 = puVar22 + 1;
  puVar5 = puVar5 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_00270a26;
LAB_0027154c:
  lVar13 = lVar13 + (ulong)uVar10;
  piVar35 = (int *)source;
  if (uVar10 < uVar15) {
    piVar35 = piVar26;
  }
  iVar25 = uVar24 - uVar10;
  lVar16 = 0;
  cVar1 = (char)puVar5 * '\x10' + (char)puVar31 * -0x10;
  do {
    cVar2 = cVar1;
    lVar14 = lVar16;
    piVar11 = (int *)(lVar13 + lVar14);
    puVar30 = (ulong *)((long)puVar5 + lVar14);
    if ((piVar11 <= piVar35) || (puVar30 <= puVar31)) break;
    lVar16 = lVar14 + -1;
    cVar1 = cVar2 + -0x10;
  } while (*(char *)((long)puVar5 + lVar14 + -1) == *(char *)(lVar13 + -1 + lVar14));
  uVar3 = iVar21 - (int)puVar31;
  uVar12 = (ulong)(uVar3 + (int)lVar14);
  uVar17 = (ulong)uVar3 + lVar14;
  iVar9 = 0;
  if (local_98 + (uVar17 & 0xffffffff) / 0xff + uVar12 + 9 <= pcVar36) {
    if ((uint)uVar17 < 0xf) {
      puVar5 = (ulong *)(local_98 + 1);
      *local_98 = cVar2;
    }
    else {
      *local_98 = -0x10;
      puVar5 = (ulong *)(local_98 + 2);
      for (iVar9 = (iVar21 - (int)puVar31) + (int)lVar14 + -0xf; 0xfe < iVar9; iVar9 = iVar9 + -0xff
          ) {
        *(char *)((long)puVar5 + -1) = -1;
        puVar5 = (ulong *)((long)puVar5 + 1);
      }
      *(char *)((long)puVar5 + -1) = (char)iVar9;
    }
    puVar19 = (ulong *)(uVar12 + (long)puVar5);
    do {
      *puVar5 = *puVar31;
      puVar5 = puVar5 + 1;
      puVar31 = puVar31 + 1;
    } while (puVar5 < puVar19);
    do {
      *(short *)puVar19 = (short)iVar25;
      if (piVar35 == piVar26) {
        puVar5 = (ulong *)((lVar4 - (long)piVar11) + (long)puVar30);
        if (puVar34 < puVar5) {
          puVar5 = puVar34;
        }
        puVar31 = (ulong *)((long)puVar30 + 4);
        puVar22 = (ulong *)(piVar11 + 1);
        puVar23 = puVar31;
        if ((ulong *)((long)puVar5 - 7U) <= puVar31) {
LAB_002717d5:
          iVar9 = ((int)puVar23 - (int)puVar30) + -4;
LAB_002717df:
          if (puVar23 < (ulong *)((long)puVar5 - 7U)) {
            if (*puVar22 == *puVar23) goto code_r0x002717f3;
            uVar12 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar3 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar23 < (ulong *)((long)puVar5 - 3U)) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < (ulong *)((long)puVar5 - 1U)) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < puVar5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
            uVar3 = (int)puVar23 - (int)puVar31;
          }
          goto LAB_00271840;
        }
        if (*puVar22 == *puVar31) {
          puVar22 = (ulong *)(piVar11 + 3);
          puVar23 = (ulong *)((long)puVar30 + 0xc);
          goto LAB_002717d5;
        }
        uVar17 = *puVar31 ^ *puVar22;
        lVar13 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar3 = (uint)lVar13 >> 3;
LAB_00271840:
        puVar31 = (ulong *)((long)puVar30 + (ulong)uVar3 + 4);
        if (puVar31 == puVar5) {
          puVar31 = puVar5;
          puVar22 = (ulong *)source;
          if (puVar7 <= puVar5) {
LAB_0027187d:
            puVar30 = (ulong *)((long)puVar30 + (lVar4 - (long)piVar11));
            if (puVar34 <= puVar30) {
              puVar30 = puVar34;
            }
            iVar9 = (int)puVar31 - (int)puVar30;
LAB_00271896:
            if (puVar31 < puVar7) {
              if (*puVar22 == *puVar31) goto code_r0x002718aa;
              uVar12 = *puVar31 ^ *puVar22;
              uVar17 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar10 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
            }
            else {
              if ((puVar31 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar22 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar31 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar22 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar31 < puVar34) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar22 == (char)*puVar31));
              }
              uVar10 = (int)puVar31 - (int)puVar5;
            }
            goto LAB_002718cf;
          }
          if (*(ulong *)source == *puVar5) {
            puVar31 = puVar5 + 1;
            puVar22 = (ulong *)(source + 8);
            goto LAB_0027187d;
          }
          uVar17 = *puVar5 ^ *(ulong *)source;
          lVar13 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar10 = (uint)lVar13 >> 3;
LAB_002718cf:
          uVar3 = uVar3 + uVar10;
          puVar31 = (ulong *)((long)puVar5 + (ulong)uVar10);
        }
      }
      else {
        puVar31 = (ulong *)((long)puVar30 + 4);
        puVar5 = (ulong *)(piVar11 + 1);
        puVar22 = puVar31;
        if (puVar7 <= puVar31) {
LAB_00271769:
          iVar9 = ((int)puVar22 - (int)puVar30) + -4;
LAB_00271771:
          if (puVar22 < puVar7) {
            if (*puVar5 == *puVar22) goto code_r0x00271789;
            uVar12 = *puVar22 ^ *puVar5;
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar3 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar22 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar5 == (int)*puVar22)
               ) {
              puVar22 = (ulong *)((long)puVar22 + 4);
              puVar5 = (ulong *)((long)puVar5 + 4);
            }
            if ((puVar22 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar5 == (short)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 2);
              puVar5 = (ulong *)((long)puVar5 + 2);
            }
            if (puVar22 < puVar34) {
              puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar5 == (char)*puVar22));
            }
            uVar3 = (int)puVar22 - (int)puVar31;
          }
          goto LAB_00271819;
        }
        if (*puVar5 == *puVar31) {
          puVar5 = (ulong *)(piVar11 + 3);
          puVar22 = (ulong *)((long)puVar30 + 0xc);
          goto LAB_00271769;
        }
        uVar17 = *puVar31 ^ *puVar5;
        lVar13 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar3 = (uint)lVar13 >> 3;
LAB_00271819:
        puVar31 = (ulong *)((long)puVar30 + (ulong)uVar3 + 4);
      }
      iVar9 = 0;
      if (pcVar36 < (char *)((long)puVar19 + (ulong)(uVar3 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar19 + 2);
      if (uVar3 < 0xf) {
        *local_98 = *local_98 + (char)uVar3;
      }
      else {
        *local_98 = *local_98 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar13 = 0;
        for (uVar10 = uVar3 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
          pcVar8 = (char *)((long)puVar19 + lVar13 + 6);
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
          lVar13 = lVar13 + 4;
        }
        lVar16 = lVar13 + ((ulong)uVar10 & 0xffff) / 0xff;
        dest = (char *)((long)puVar19 + lVar16 + 3);
        *(char *)((long)puVar19 + lVar16 + 2) =
             (char)lVar13 + (char)((uVar10 & 0xffff) / 0xff) + (char)uVar3 + -0xf;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar31) goto LAB_00271bad;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar31 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar31 + -2) - iVar18;
      uVar17 = *puVar31 * -0x30e4432345000000 >> 0x34;
      uVar10 = (int)puVar31 - iVar18;
      uVar3 = *(uint *)((long)LZ4_stream + uVar17 * 4);
      piVar35 = (int *)source;
      lVar13 = lVar28;
      if (uVar3 < uVar15) {
        piVar35 = piVar26;
        lVar13 = lVar29;
      }
      piVar11 = (int *)(lVar13 + (ulong)uVar3);
      *(uint *)((long)LZ4_stream + uVar17 * 4) = uVar10;
      local_98 = dest;
      if ((uVar3 + 0xffff < uVar10) || (*piVar11 != (int)*puVar31)) goto LAB_002714e9;
      puVar19 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar25 = uVar10 - uVar3;
      puVar30 = puVar31;
    } while( true );
  }
  goto LAB_00271c88;
code_r0x002717f3:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_002717df;
code_r0x002718aa:
  puVar31 = puVar31 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_00271896;
code_r0x00271789:
  puVar22 = puVar22 + 1;
  puVar5 = puVar5 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_00271771;
LAB_0026f948:
  lVar13 = lVar13 + (ulong)uVar10;
  piVar26 = (int *)source;
  if (uVar10 < uVar3) {
    piVar26 = piVar35;
  }
  iVar25 = uVar24 - uVar10;
  lVar16 = 0;
  cVar1 = (char)puVar5 * '\x10' + (char)puVar31 * -0x10;
  do {
    cVar2 = cVar1;
    lVar14 = lVar16;
    piVar11 = (int *)(lVar13 + lVar14);
    puVar30 = (ulong *)((long)puVar5 + lVar14);
    if ((piVar11 <= piVar26) || (puVar30 <= puVar31)) break;
    lVar16 = lVar14 + -1;
    cVar1 = cVar2 + -0x10;
  } while (*(char *)((long)puVar5 + lVar14 + -1) == *(char *)(lVar13 + -1 + lVar14));
  uVar15 = iVar21 - (int)puVar31;
  uVar12 = (ulong)(uVar15 + (int)lVar14);
  uVar17 = (ulong)uVar15 + lVar14;
  iVar9 = 0;
  if (local_b0 + (uVar17 & 0xffffffff) / 0xff + uVar12 + 9 <= pcVar36) {
    if ((uint)uVar17 < 0xf) {
      puVar5 = (ulong *)(local_b0 + 1);
      *local_b0 = cVar2;
    }
    else {
      *local_b0 = -0x10;
      puVar5 = (ulong *)(local_b0 + 2);
      for (iVar9 = (iVar21 - (int)puVar31) + (int)lVar14 + -0xf; 0xfe < iVar9; iVar9 = iVar9 + -0xff
          ) {
        *(char *)((long)puVar5 + -1) = -1;
        puVar5 = (ulong *)((long)puVar5 + 1);
      }
      *(char *)((long)puVar5 + -1) = (char)iVar9;
    }
    puVar19 = (ulong *)(uVar12 + (long)puVar5);
    do {
      *puVar5 = *puVar31;
      puVar5 = puVar5 + 1;
      puVar31 = puVar31 + 1;
    } while (puVar5 < puVar19);
    do {
      *(short *)puVar19 = (short)iVar25;
      if (piVar26 == piVar35) {
        puVar5 = (ulong *)((lVar29 - (long)piVar11) + (long)puVar30);
        if (puVar7 < puVar5) {
          puVar5 = puVar7;
        }
        puVar31 = (ulong *)((long)puVar30 + 4);
        puVar22 = (ulong *)(piVar11 + 1);
        puVar23 = puVar31;
        if ((ulong *)((long)puVar5 - 7U) <= puVar31) {
LAB_0026fbdb:
          iVar9 = ((int)puVar23 - (int)puVar30) + -4;
LAB_0026fbe5:
          if (puVar23 < (ulong *)((long)puVar5 - 7U)) {
            if (*puVar22 == *puVar23) goto code_r0x0026fbf9;
            uVar12 = *puVar23 ^ *puVar22;
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar15 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar23 < (ulong *)((long)puVar5 - 3U)) && ((int)*puVar22 == (int)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 4);
              puVar22 = (ulong *)((long)puVar22 + 4);
            }
            if ((puVar23 < (ulong *)((long)puVar5 - 1U)) && ((short)*puVar22 == (short)*puVar23)) {
              puVar23 = (ulong *)((long)puVar23 + 2);
              puVar22 = (ulong *)((long)puVar22 + 2);
            }
            if (puVar23 < puVar5) {
              puVar23 = (ulong *)((long)puVar23 + (ulong)((char)*puVar22 == (char)*puVar23));
            }
            uVar15 = (int)puVar23 - (int)puVar31;
          }
          goto LAB_0026fc46;
        }
        if (*puVar22 == *puVar31) {
          puVar22 = (ulong *)(piVar11 + 3);
          puVar23 = (ulong *)((long)puVar30 + 0xc);
          goto LAB_0026fbdb;
        }
        uVar17 = *puVar31 ^ *puVar22;
        lVar13 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar15 = (uint)lVar13 >> 3;
LAB_0026fc46:
        puVar31 = (ulong *)((long)puVar30 + (ulong)uVar15 + 4);
        if (puVar31 == puVar5) {
          puVar31 = puVar5;
          puVar22 = (ulong *)source;
          if (puVar34 <= puVar5) {
LAB_0026fc83:
            puVar30 = (ulong *)((long)puVar30 + (lVar29 - (long)piVar11));
            if (puVar7 <= puVar30) {
              puVar30 = puVar7;
            }
            iVar9 = (int)puVar31 - (int)puVar30;
LAB_0026fc9c:
            if (puVar31 < puVar34) {
              if (*puVar22 == *puVar31) goto code_r0x0026fcb0;
              uVar12 = *puVar31 ^ *puVar22;
              uVar17 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar10 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
            }
            else {
              if ((puVar31 < source + ((ulong)(uint)inputSize - 8)) &&
                 ((int)*puVar22 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar22 = (ulong *)((long)puVar22 + 4);
              }
              if ((puVar31 < source + ((ulong)(uint)inputSize - 6)) &&
                 ((short)*puVar22 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar22 = (ulong *)((long)puVar22 + 2);
              }
              if (puVar31 < puVar7) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar22 == (char)*puVar31));
              }
              uVar10 = (int)puVar31 - (int)puVar5;
            }
            goto LAB_0026fcd5;
          }
          if (*(ulong *)source == *puVar5) {
            puVar31 = puVar5 + 1;
            puVar22 = (ulong *)(source + 8);
            goto LAB_0026fc83;
          }
          uVar17 = *puVar5 ^ *(ulong *)source;
          lVar13 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
            }
          }
          uVar10 = (uint)lVar13 >> 3;
LAB_0026fcd5:
          uVar15 = uVar15 + uVar10;
          puVar31 = (ulong *)((long)puVar5 + (ulong)uVar10);
        }
      }
      else {
        puVar31 = (ulong *)((long)puVar30 + 4);
        puVar5 = (ulong *)(piVar11 + 1);
        puVar22 = puVar31;
        if (puVar34 <= puVar31) {
LAB_0026fb6f:
          iVar9 = ((int)puVar22 - (int)puVar30) + -4;
LAB_0026fb77:
          if (puVar22 < puVar34) {
            if (*puVar5 == *puVar22) goto code_r0x0026fb8f;
            uVar12 = *puVar22 ^ *puVar5;
            uVar17 = 0;
            if (uVar12 != 0) {
              for (; (uVar12 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
              }
            }
            uVar15 = ((uint)(uVar17 >> 3) & 0x1fffffff) + iVar9;
          }
          else {
            if ((puVar22 < source + ((ulong)(uint)inputSize - 8)) && ((int)*puVar5 == (int)*puVar22)
               ) {
              puVar22 = (ulong *)((long)puVar22 + 4);
              puVar5 = (ulong *)((long)puVar5 + 4);
            }
            if ((puVar22 < source + ((ulong)(uint)inputSize - 6)) &&
               ((short)*puVar5 == (short)*puVar22)) {
              puVar22 = (ulong *)((long)puVar22 + 2);
              puVar5 = (ulong *)((long)puVar5 + 2);
            }
            if (puVar22 < puVar7) {
              puVar22 = (ulong *)((long)puVar22 + (ulong)((char)*puVar5 == (char)*puVar22));
            }
            uVar15 = (int)puVar22 - (int)puVar31;
          }
          goto LAB_0026fc1f;
        }
        if (*puVar5 == *puVar31) {
          puVar5 = (ulong *)(piVar11 + 3);
          puVar22 = (ulong *)((long)puVar30 + 0xc);
          goto LAB_0026fb6f;
        }
        uVar17 = *puVar31 ^ *puVar5;
        lVar13 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
          }
        }
        uVar15 = (uint)lVar13 >> 3;
LAB_0026fc1f:
        puVar31 = (ulong *)((long)puVar30 + (ulong)uVar15 + 4);
      }
      iVar9 = 0;
      if (pcVar36 < (char *)((long)puVar19 + (ulong)(uVar15 + 0xf0) / 0xff + 8)) break;
      dest = (char *)((long)puVar19 + 2);
      if (uVar15 < 0xf) {
        *local_b0 = *local_b0 + (char)uVar15;
      }
      else {
        *local_b0 = *local_b0 + '\x0f';
        dest[0] = -1;
        dest[1] = -1;
        dest[2] = -1;
        dest[3] = -1;
        lVar13 = 0;
        for (uVar10 = uVar15 - 0xf; 0x3fb < uVar10; uVar10 = uVar10 - 0x3fc) {
          pcVar8 = (char *)((long)puVar19 + lVar13 + 6);
          pcVar8[0] = -1;
          pcVar8[1] = -1;
          pcVar8[2] = -1;
          pcVar8[3] = -1;
          lVar13 = lVar13 + 4;
        }
        lVar16 = lVar13 + ((ulong)uVar10 & 0xffff) / 0xff;
        dest = (char *)((long)puVar19 + lVar16 + 3);
        *(char *)((long)puVar19 + lVar16 + 2) =
             (char)lVar13 + (char)((uVar10 & 0xffff) / 0xff) + (char)uVar15 + -0xf;
      }
      if (source + ((ulong)(uint)inputSize - 0xb) <= puVar31) goto LAB_00271a29;
      *(int *)((long)LZ4_stream +
              ((ulong)(*(long *)((long)puVar31 + -2) * -0x30e4432345000000) >> 0x34) * 4) =
           ((int)puVar31 + -2) - iVar18;
      uVar17 = *puVar31 * -0x30e4432345000000 >> 0x34;
      uVar10 = (int)puVar31 - iVar18;
      uVar15 = *(uint *)((long)LZ4_stream + uVar17 * 4);
      piVar26 = (int *)source;
      lVar13 = lVar28;
      if (uVar15 < uVar3) {
        piVar26 = piVar35;
        lVar13 = lVar4;
      }
      piVar11 = (int *)(lVar13 + (ulong)uVar15);
      *(uint *)((long)LZ4_stream + uVar17 * 4) = uVar10;
      local_b0 = dest;
      if ((uVar15 + 0xffff < uVar10) || (*piVar11 != (int)*puVar31)) goto LAB_0026f8d9;
      puVar19 = (ulong *)(dest + 1);
      *dest = '\0';
      iVar25 = uVar10 - uVar15;
      puVar30 = puVar31;
    } while( true );
  }
  goto LAB_00271c88;
code_r0x0026fbf9:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_0026fbe5;
code_r0x0026fcb0:
  puVar31 = puVar31 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_0026fc9c;
code_r0x0026fb8f:
  puVar22 = puVar22 + 1;
  puVar5 = puVar5 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_0026fb77;
LAB_00271a29:
  pcVar8 = source + ((ulong)(uint)inputSize - (long)puVar31);
  iVar9 = 0;
  if (pcVar36 < dest + (long)(pcVar8 + (ulong)(pcVar8 + 0xf0) / 0xff + 1)) goto LAB_00271c88;
  if (pcVar8 < (char *)0xf) {
    *dest = (char)pcVar8 << 4;
  }
  else {
    *dest = -0x10;
    for (pcVar36 = pcVar8 + -0xf; dest = dest + 1, (char *)0xfe < pcVar36; pcVar36 = pcVar36 + -0xff
        ) {
      *dest = -1;
    }
    *dest = (char)pcVar36;
  }
LAB_00271c18:
  pcVar36 = dest + 1;
  iVar9 = (int)pcVar36;
LAB_00271c78:
  memcpy(pcVar36,puVar31,(size_t)pcVar8);
  iVar9 = (iVar9 + (int)pcVar8) - local_90;
  goto LAB_00271c88;
code_r0x002711a1:
  puVar23 = puVar23 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_0027118d;
code_r0x00271252:
  puVar31 = puVar31 + 1;
  puVar22 = puVar22 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_0027123e;
code_r0x00271136:
  puVar22 = puVar22 + 1;
  puVar5 = puVar5 + 1;
  iVar9 = iVar9 + 8;
  goto LAB_0027111e;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* const streamPtr = &LZ4_stream->internal_donotuse;
    const char* dictEnd = streamPtr->dictSize ? (const char*)streamPtr->dictionary + streamPtr->dictSize : NULL;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i, dictSize=%u)", inputSize, streamPtr->dictSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* fix index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize < 4)     /* tiny dictionary : not enough for a hash */
      && (dictEnd != source)           /* prefix mode */
      && (inputSize > 0)               /* tolerance : don't lose history, in case next invocation would use prefix mode */
      && (streamPtr->dictCtx == NULL)  /* usingDictCtx */
      ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        /* remove dictionary existence from history, to employ faster prefix mode */
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = source;
    }

    /* Check overlapping input/dictionary space */
    {   const char* const sourceEnd = source + inputSize;
        if ((sourceEnd > (const char*)streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = (const BYTE*)dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {  /* small data <= 4 KB */
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}